

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void yang_free_ext_data(yang_ext_substmt *substmt)

{
  char **__ptr;
  long lVar1;
  
  if (substmt != (yang_ext_substmt *)0x0) {
    free(substmt->ext_substmt);
    __ptr = substmt->ext_modules;
    if (__ptr != (char **)0x0) {
      lVar1 = 0;
      while (*(void **)((long)__ptr + lVar1) != (void *)0x0) {
        free(*(void **)((long)__ptr + lVar1));
        lVar1 = lVar1 + 8;
        __ptr = substmt->ext_modules;
      }
      free(__ptr);
    }
    free(substmt);
    return;
  }
  return;
}

Assistant:

void
yang_free_ext_data(struct yang_ext_substmt *substmt)
{
    int i;

    if (!substmt) {
        return;
    }

    free(substmt->ext_substmt);
    if (substmt->ext_modules) {
        for (i = 0; substmt->ext_modules[i]; ++i) {
            free(substmt->ext_modules[i]);
        }
        free(substmt->ext_modules);
    }
    free(substmt);
}